

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

void Gia_ManCountFanoutlessFlops(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pObj;
  uint uVar2;
  int iVar3;
  
  Gia_ManCreateRefs(p);
  uVar2 = 0;
  for (iVar3 = 0; iVar3 < p->nRegs; iVar3 = iVar3 + 1) {
    pObj = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar3);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjRefNum(p,pObj);
    uVar2 = uVar2 + (iVar1 == 0);
  }
  printf("Fanoutless flops = %d.\n",(ulong)uVar2);
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  return;
}

Assistant:

void Gia_ManCountFanoutlessFlops( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    int Counter = 0;
    Gia_ManCreateRefs( p );
    Gia_ManForEachRo( p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) == 0 )
            Counter++;
    printf( "Fanoutless flops = %d.\n", Counter );
    ABC_FREE( p->pRefs );
}